

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::TabBarLayout(ImGuiTabBar *tab_bar)

{
  ImVector<ImGuiShrinkWidthItem> *this;
  float fVar1;
  ImVec2 IVar2;
  ImGuiWindow *pIVar3;
  ImVec2 IVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  ImGuiTabItemFlags IVar9;
  ImS16 IVar10;
  ImS16 IVar11;
  ImGuiContext *pIVar12;
  ImGuiContext *pIVar13;
  bool bVar14;
  bool bVar15;
  ImGuiID IVar16;
  ImGuiTabItem *pIVar17;
  ImGuiTabItem *pIVar18;
  char *pcVar19;
  ImGuiShrinkWidthItem *pIVar20;
  ImGuiTabItem *pIVar21;
  byte bVar22;
  long lVar23;
  ulong uVar24;
  uint uVar25;
  int iVar26;
  int tab_n;
  int iVar27;
  int iVar28;
  int iVar29;
  int tab_src_n;
  int iVar30;
  uint uVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  ImGuiID local_12c;
  float local_124;
  undefined1 local_118 [16];
  ImVec2 local_100;
  ImGuiTabBarSection sections [3];
  int shrink_buffer_indexes [3];
  ImVec2 local_a8;
  ImVec4 local_98;
  undefined8 local_80;
  ImVec2 local_78;
  ulong local_70;
  undefined1 local_68 [16];
  ImVec4 arrow_col;
  
  pIVar13 = GImGui;
  tab_bar->WantLayout = false;
  sections[1].Width = 0.0;
  sections[1].Spacing = 0.0;
  sections[2].TabCount = 0;
  sections[2].Width = 0.0;
  sections[0].TabCount = 0;
  sections[0].Width = 0.0;
  sections[0].Spacing = 0.0;
  sections[1].TabCount = 0;
  sections[2].Spacing = 0.0;
  bVar22 = 0;
  iVar27 = 0;
  for (iVar30 = 0; iVar28 = (tab_bar->Tabs).Size, iVar30 < iVar28; iVar30 = iVar30 + 1) {
    pIVar17 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,iVar30);
    if ((pIVar17->LastFrameVisible < tab_bar->PrevFrameVisible) || (pIVar17->WantClose == true)) {
      IVar16 = pIVar17->ID;
      if (tab_bar->VisibleTabId == IVar16) {
        tab_bar->VisibleTabId = 0;
      }
      if (tab_bar->SelectedTabId == IVar16) {
        tab_bar->SelectedTabId = 0;
      }
      if (tab_bar->NextSelectedTabId == IVar16) {
        tab_bar->NextSelectedTabId = 0;
      }
    }
    else {
      if (iVar30 != iVar27) {
        pIVar17 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,iVar30);
        pIVar18 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,iVar27);
        IVar9 = pIVar17->Flags;
        iVar28 = pIVar17->LastFrameVisible;
        iVar29 = pIVar17->LastFrameSelected;
        fVar33 = pIVar17->Offset;
        fVar34 = pIVar17->Width;
        fVar36 = pIVar17->ContentWidth;
        IVar10 = pIVar17->NameOffset;
        IVar11 = pIVar17->BeginOrder;
        pIVar18->ID = pIVar17->ID;
        pIVar18->Flags = IVar9;
        pIVar18->LastFrameVisible = iVar28;
        pIVar18->LastFrameSelected = iVar29;
        pIVar18->Offset = fVar33;
        pIVar18->Width = fVar34;
        pIVar18->ContentWidth = fVar36;
        pIVar18->NameOffset = IVar10;
        pIVar18->BeginOrder = IVar11;
        *(undefined4 *)((long)&pIVar18->BeginOrder + 1) =
             *(undefined4 *)((long)&pIVar17->BeginOrder + 1);
      }
      pIVar17 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,iVar27);
      pIVar17->IndexDuringLayout = (ImS16)iVar27;
      uVar31 = pIVar17->Flags;
      lVar23 = 0;
      if ((uVar31 & 0x40) == 0) {
        lVar23 = (ulong)((char)(byte)uVar31 < '\0') + 1;
      }
      if (0 < iVar27) {
        pIVar17 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,iVar27 + -1);
        bVar22 = (pIVar17->Flags & 0x40U) == 0 & (byte)uVar31 >> 6 | bVar22 |
                 ((uVar31 & 0xc0) != 0x80 && (pIVar17->Flags & 0xc0U) == 0x80);
      }
      sections[lVar23].TabCount = sections[lVar23].TabCount + 1;
      iVar27 = iVar27 + 1;
    }
  }
  if (iVar28 != iVar27) {
    ImVector<ImGuiTabItem>::resize(&tab_bar->Tabs,iVar27);
  }
  if (bVar22 != 0) {
    qsort((tab_bar->Tabs).Data,(long)(tab_bar->Tabs).Size,0x24,TabItemComparerBySection);
  }
  iVar27 = sections[0].TabCount;
  local_70 = (ulong)(uint)sections[1].TabCount;
  iVar30 = sections[2].TabCount;
  local_124 = 0.0;
  fVar33 = 0.0;
  if (0 < sections[1].TabCount + sections[2].TabCount && 0 < sections[0].TabCount) {
    fVar33 = (pIVar13->Style).ItemInnerSpacing.x;
  }
  sections[0].Spacing = fVar33;
  if (0 < sections[2].TabCount && 0 < sections[1].TabCount) {
    local_124 = (pIVar13->Style).ItemInnerSpacing.x;
  }
  sections[1].Spacing = local_124;
  local_12c = tab_bar->NextSelectedTabId;
  if (local_12c != 0) {
    tab_bar->SelectedTabId = local_12c;
    tab_bar->NextSelectedTabId = 0;
  }
  if (tab_bar->ReorderRequestTabId != 0) {
    bVar14 = TabBarProcessReorder(tab_bar);
    if ((bVar14) && (tab_bar->ReorderRequestTabId == tab_bar->SelectedTabId)) {
      local_12c = tab_bar->ReorderRequestTabId;
    }
    tab_bar->ReorderRequestTabId = 0;
  }
  pIVar12 = GImGui;
  if ((tab_bar->Flags & 4) != 0) {
    pIVar3 = GImGui->CurrentWindow;
    fVar34 = (GImGui->Style).FramePadding.y;
    fVar36 = GImGui->FontSize;
    IVar4 = (pIVar3->DC).CursorPos;
    fVar35 = (tab_bar->BarRect).Min.y;
    (pIVar3->DC).CursorPos.x = (tab_bar->BarRect).Min.x - fVar34;
    (pIVar3->DC).CursorPos.y = fVar35;
    (tab_bar->BarRect).Min.x = fVar36 + fVar34 + (tab_bar->BarRect).Min.x;
    arrow_col.x = (pIVar12->Style).Colors[0].x;
    arrow_col.y = (pIVar12->Style).Colors[0].y;
    uVar5 = (pIVar12->Style).Colors[0].z;
    uVar6 = (pIVar12->Style).Colors[0].w;
    arrow_col.w = (float)uVar6 * 0.5;
    arrow_col.z = (float)uVar5;
    iVar28 = 0;
    PushStyleColor(0,&arrow_col);
    local_98.x = 0.0;
    local_98.y = 0.0;
    local_98.z = 0.0;
    local_98.w = 0.0;
    PushStyleColor(0x15,&local_98);
    bVar14 = BeginCombo("##v",(char *)0x0,0x50);
    PopStyleColor(2);
    if (bVar14) {
      local_118._0_8_ = pIVar3;
      pIVar17 = (ImGuiTabItem *)0x0;
      local_100 = IVar4;
      for (; iVar28 < (tab_bar->Tabs).Size; iVar28 = iVar28 + 1) {
        pIVar18 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,iVar28);
        if ((pIVar18->Flags & 0x200000) == 0) {
          pcVar19 = ImGuiTabBar::GetTabName(tab_bar,pIVar18);
          local_98.x = 0.0;
          local_98.y = 0.0;
          bVar14 = Selectable(pcVar19,tab_bar->SelectedTabId == pIVar18->ID,0,(ImVec2 *)&local_98);
          if (bVar14) {
            pIVar17 = pIVar18;
          }
        }
      }
      EndPopup();
      (pIVar3->DC).CursorPos = local_100;
      if (pIVar17 != (ImGuiTabItem *)0x0) {
        local_12c = pIVar17->ID;
        tab_bar->SelectedTabId = local_12c;
      }
    }
    else {
      (pIVar3->DC).CursorPos = IVar4;
    }
  }
  shrink_buffer_indexes[0] = 0;
  shrink_buffer_indexes[1] = iVar30 + iVar27;
  shrink_buffer_indexes[2] = iVar27;
  this = &pIVar13->ShrinkWidthBuffer;
  ImVector<ImGuiShrinkWidthItem>::resize(this,(tab_bar->Tabs).Size);
  local_100 = (ImVec2)((ulong)local_100 & 0xffffffff00000000);
  pIVar17 = (ImGuiTabItem *)0x0;
  uVar31 = 0xffffffff;
  for (iVar30 = 0; iVar28 = (tab_bar->Tabs).Size, iVar30 < iVar28; iVar30 = iVar30 + 1) {
    pIVar18 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,iVar30);
    if (pIVar18->LastFrameVisible < tab_bar->PrevFrameVisible) {
      __assert_fail("tab->LastFrameVisible >= tab_bar->PrevFrameVisible",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_widgets.cpp"
                    ,0x1bc3,"void ImGui::TabBarLayout(ImGuiTabBar *)");
    }
    if (((pIVar17 == (ImGuiTabItem *)0x0) ||
        (pIVar17->LastFrameSelected < pIVar18->LastFrameSelected)) &&
       ((pIVar18->Flags & 0x200000) == 0)) {
      pIVar17 = pIVar18;
    }
    IVar16 = pIVar18->ID;
    uVar25 = (uint)local_100.x & 0xff;
    if (IVar16 == tab_bar->SelectedTabId) {
      uVar25 = 1;
    }
    local_100.x = (float)uVar25;
    if ((local_12c == 0) && (local_12c = IVar16, pIVar13->NavJustMovedToId != IVar16)) {
      local_12c = 0;
    }
    pcVar19 = ImGuiTabBar::GetTabName(tab_bar,pIVar18);
    IVar4 = TabItemCalcSize(pcVar19,((uint)pIVar18->Flags >> 0x14 & 1) == 0);
    pIVar18->ContentWidth = IVar4.x;
    uVar25 = ((char)pIVar18->Flags < '\0') + 1;
    if ((pIVar18->Flags & 0x40U) != 0) {
      uVar25 = 0;
    }
    fVar34 = 0.0;
    if (uVar25 == uVar31) {
      fVar34 = (pIVar13->Style).ItemInnerSpacing.x;
    }
    sections[uVar25].Width = IVar4.x + fVar34 + sections[uVar25].Width;
    iVar28 = shrink_buffer_indexes[uVar25];
    shrink_buffer_indexes[uVar25] = iVar28 + 1;
    pIVar20 = ImVector<ImGuiShrinkWidthItem>::operator[](this,iVar28);
    pIVar20->Index = iVar30;
    fVar34 = pIVar18->ContentWidth;
    local_118._0_4_ = fVar34;
    pIVar20 = ImVector<ImGuiShrinkWidthItem>::operator[](this,iVar28);
    pIVar20->Width = fVar34;
    if (pIVar18->ContentWidth <= 0.0) {
      __assert_fail("tab->ContentWidth > 0.0f",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_widgets.cpp"
                    ,0x1bdd,"void ImGui::TabBarLayout(ImGuiTabBar *)");
    }
    pIVar18->Width = pIVar18->ContentWidth;
    uVar31 = uVar25;
  }
  fVar34 = 0.0;
  for (lVar23 = 8; lVar23 != 0x2c; lVar23 = lVar23 + 0xc) {
    fVar34 = fVar34 + *(float *)((long)sections + lVar23 + -4) +
                      *(float *)((long)&sections[0].TabCount + lVar23);
  }
  tab_bar->WidthAllTabsIdeal = fVar34;
  pIVar12 = GImGui;
  fVar36 = (tab_bar->BarRect).Max.x;
  if (((1 < iVar28) && (fVar36 - (tab_bar->BarRect).Min.x < fVar34)) &&
     ((tab_bar->Flags & 0x90U) == 0x80)) {
    pIVar3 = GImGui->CurrentWindow;
    fVar35 = GImGui->FontSize + -2.0;
    local_68 = ZEXT416((uint)fVar35);
    fVar34 = (GImGui->Style).FramePadding.y;
    local_a8.y = fVar34 + fVar34 + GImGui->FontSize;
    fVar35 = fVar35 + fVar35;
    local_118 = ZEXT416((uint)fVar35);
    local_78 = (pIVar3->DC).CursorPos;
    arrow_col.x = (GImGui->Style).Colors[0].x;
    arrow_col.y = (GImGui->Style).Colors[0].y;
    uVar7 = (GImGui->Style).Colors[0].z;
    uVar8 = (GImGui->Style).Colors[0].w;
    arrow_col.w = (float)uVar8 * 0.5;
    arrow_col.z = (float)uVar7;
    PushStyleColor(0,&arrow_col);
    local_98.x = 0.0;
    local_98.y = 0.0;
    local_98.z = 0.0;
    local_98.w = 0.0;
    PushStyleColor(0x15,&local_98);
    local_80._0_4_ = (pIVar12->IO).KeyRepeatDelay;
    local_80._4_4_ = (pIVar12->IO).KeyRepeatRate;
    (pIVar12->IO).KeyRepeatDelay = 0.25;
    (pIVar12->IO).KeyRepeatRate = 0.2;
    fVar34 = (tab_bar->BarRect).Min.x;
    fVar36 = (tab_bar->BarRect).Max.x - fVar35;
    uVar31 = -(uint)(fVar36 <= fVar34);
    fVar36 = (float)(uVar31 & (uint)fVar34 | ~uVar31 & (uint)fVar36);
    fVar34 = (tab_bar->BarRect).Min.y;
    (pIVar3->DC).CursorPos.x = fVar36;
    (pIVar3->DC).CursorPos.y = fVar34;
    local_a8.x = (float)local_68._0_4_;
    IVar4.y = local_a8.y;
    IVar4.x = (float)local_68._0_4_;
    bVar14 = ArrowButtonEx("##<",0,IVar4,0x410);
    fVar34 = (tab_bar->BarRect).Min.y;
    (pIVar3->DC).CursorPos.x = fVar36 + (float)local_68._0_4_;
    (pIVar3->DC).CursorPos.y = fVar34;
    bVar15 = ArrowButtonEx("##>",1,local_a8,0x410);
    iVar30 = -(uint)bVar14;
    if (bVar15) {
      iVar30 = 1;
    }
    PopStyleColor(2);
    (pIVar12->IO).KeyRepeatDelay = (float)(undefined4)local_80;
    (pIVar12->IO).KeyRepeatRate = (float)local_80._4_4_;
    if ((iVar30 == 0) ||
       (pIVar18 = TabBarFindTabByID(tab_bar,tab_bar->SelectedTabId), pIVar18 == (ImGuiTabItem *)0x0)
       ) {
      pIVar18 = (ImGuiTabItem *)0x0;
    }
    else {
      iVar28 = ImVector<ImGuiTabItem>::index_from_ptr(&tab_bar->Tabs,pIVar18);
      iVar29 = iVar28 + iVar30;
      pIVar18 = (ImGuiTabItem *)0x0;
      while (pIVar18 == (ImGuiTabItem *)0x0) {
        if ((iVar29 < 0) || (iVar26 = iVar29, (tab_bar->Tabs).Size <= iVar29)) {
          iVar26 = iVar28;
        }
        pIVar21 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,iVar26);
        pIVar18 = pIVar21;
        if ((pIVar21->Flags & 0x200000) != 0) {
          iVar28 = iVar28 + iVar30;
          iVar29 = iVar29 + iVar30;
          if ((-1 < iVar29) && (pIVar18 = (ImGuiTabItem *)0x0, (tab_bar->Tabs).Size <= iVar29)) {
            pIVar18 = pIVar21;
          }
        }
      }
    }
    (pIVar3->DC).CursorPos = local_78;
    fVar36 = (tab_bar->BarRect).Max.x - (fVar35 + 1.0);
    (tab_bar->BarRect).Max.x = fVar36;
    if ((pIVar18 != (ImGuiTabItem *)0x0) &&
       (local_12c = pIVar18->ID, (pIVar18->Flags & 0x200000) == 0)) {
      tab_bar->SelectedTabId = local_12c;
    }
  }
  fVar34 = sections[0].Width + fVar33 + sections[2].Width + 0.0;
  fVar36 = fVar36 - (tab_bar->BarRect).Min.x;
  if (fVar34 < fVar36) {
    fVar35 = (sections[1].Width + local_124) -
             ((fVar36 - (sections[0].Width + fVar33)) - (sections[2].Width + 0.0));
    if (0.0 <= fVar35) goto LAB_0016417d;
  }
  else {
    fVar35 = fVar34 - fVar36;
LAB_0016417d:
    if ((0.0 < fVar35) && ((fVar36 <= fVar34 || ((tab_bar->Flags & 0x40U) != 0)))) {
      uVar31 = (uint)local_70;
      if (fVar36 <= fVar34) {
        uVar31 = sections[2].TabCount + iVar27;
      }
      uVar24 = (ulong)(uint)(sections[2].TabCount + iVar27);
      if (fVar36 <= fVar34) {
        uVar24 = 0;
      }
      iVar30 = (int)uVar24;
      ShrinkWidths((pIVar13->ShrinkWidthBuffer).Data + iVar30,uVar31,fVar35);
      while (iVar28 = (int)uVar24, iVar28 < (int)(iVar30 + uVar31)) {
        pIVar20 = ImVector<ImGuiShrinkWidthItem>::operator[](this,iVar28);
        pIVar18 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,pIVar20->Index);
        pIVar20 = ImVector<ImGuiShrinkWidthItem>::operator[](this,iVar28);
        if (-1 < (int)pIVar20->Width) {
          fVar34 = (float)(int)pIVar20->Width;
          uVar24 = (ulong)((char)pIVar18->Flags < '\0') + 1;
          if ((pIVar18->Flags & 0x40U) != 0) {
            uVar24 = 0;
          }
          sections[uVar24].Width = sections[uVar24].Width - (pIVar18->Width - fVar34);
          pIVar18->Width = fVar34;
        }
        uVar24 = (ulong)(iVar28 + 1);
      }
    }
  }
  tab_bar->WidthAllTabs = 0.0;
  iVar30 = 0;
  fVar34 = 0.0;
  for (lVar23 = 0; lVar23 != 3; lVar23 = lVar23 + 1) {
    local_118._0_4_ = fVar34;
    if ((lVar23 == 2) &&
       (local_118._0_4_ = ((tab_bar->BarRect).Max.x - (tab_bar->BarRect).Min.x) - sections[2].Width,
       local_118._0_4_ = ~-(uint)((float)local_118._0_4_ <= 0.0) & local_118._0_4_,
       fVar34 <= (float)local_118._0_4_)) {
      local_118._0_4_ = fVar34;
    }
    iVar28 = sections[lVar23].TabCount;
    iVar29 = 0;
    iVar26 = 0;
    if (0 < iVar28) {
      iVar29 = iVar28;
      iVar26 = 0;
    }
    for (; iVar29 != iVar26; iVar26 = iVar26 + 1) {
      pIVar18 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,iVar30 + iVar26);
      pIVar18->Offset = (float)local_118._0_4_;
      fVar34 = 0.0;
      if (iVar26 < iVar28 + -1) {
        fVar34 = (pIVar13->Style).ItemInnerSpacing.x;
      }
      local_118._0_4_ = (float)local_118._0_4_ + fVar34 + pIVar18->Width;
    }
    fVar34 = sections[lVar23].Spacing;
    fVar36 = sections[lVar23].Width + fVar34;
    tab_bar->WidthAllTabs = (float)(-(uint)(0.0 <= fVar36) & (uint)fVar36) + tab_bar->WidthAllTabs;
    fVar34 = (float)local_118._0_4_ + fVar34;
    iVar30 = iVar28 + iVar30;
  }
  if (((ulong)local_100 & 1) == 0) {
    tab_bar->SelectedTabId = 0;
LAB_001642ba:
    IVar16 = 0;
    if ((tab_bar->NextSelectedTabId == 0) && (IVar16 = 0, pIVar17 != (ImGuiTabItem *)0x0)) {
      IVar16 = pIVar17->ID;
      tab_bar->SelectedTabId = IVar16;
      local_12c = IVar16;
    }
  }
  else {
    IVar16 = tab_bar->SelectedTabId;
    if (IVar16 == 0) goto LAB_001642ba;
  }
  tab_bar->VisibleTabId = IVar16;
  tab_bar->VisibleTabWasSubmitted = false;
  if (((local_12c != 0) &&
      (pIVar17 = TabBarFindTabByID(tab_bar,local_12c), pIVar17 != (ImGuiTabItem *)0x0)) &&
     ((pIVar17->Flags & 0xc0) == 0)) {
    fVar34 = GImGui->FontSize;
    iVar30 = ImVector<ImGuiTabItem>::index_from_ptr(&tab_bar->Tabs,pIVar17);
    fVar36 = (tab_bar->BarRect).Max.x;
    fVar35 = (tab_bar->BarRect).Min.x;
    fVar32 = pIVar17->Offset - sections[0].Width;
    fVar37 = fVar34;
    if (iVar30 < iVar27) {
      fVar37 = -0.0;
    }
    fVar37 = fVar32 - fVar37;
    fVar1 = pIVar17->Width;
    if ((tab_bar->Tabs).Size - sections[2].TabCount <= iVar30 + 1) {
      fVar34 = 1.0;
    }
    tab_bar->ScrollingTargetDistToVisibility = 0.0;
    fVar34 = fVar32 + fVar1 + fVar34;
    if ((fVar37 < tab_bar->ScrollingTarget) ||
       (fVar36 = (((fVar36 - fVar35) - sections[0].Width) - sections[2].Width) - local_124,
       fVar36 <= fVar34 - fVar37)) {
      fVar35 = tab_bar->ScrollingAnim - fVar34;
    }
    else {
      if (fVar34 - fVar36 <= tab_bar->ScrollingTarget) goto LAB_001644a5;
      fVar35 = (fVar37 - fVar36) - tab_bar->ScrollingAnim;
      fVar37 = fVar34 - fVar36;
    }
    tab_bar->ScrollingTargetDistToVisibility = (float)(-(uint)(0.0 <= fVar35) & (uint)fVar35);
    tab_bar->ScrollingTarget = fVar37;
  }
LAB_001644a5:
  fVar34 = TabBarScrollClamp(tab_bar,tab_bar->ScrollingAnim);
  tab_bar->ScrollingAnim = fVar34;
  fVar36 = TabBarScrollClamp(tab_bar,tab_bar->ScrollingTarget);
  tab_bar->ScrollingTarget = fVar36;
  if ((fVar34 != fVar36) || (NAN(fVar34) || NAN(fVar36))) {
    fVar35 = pIVar13->FontSize;
    fVar37 = fVar35 * 70.0;
    uVar31 = -(uint)(fVar37 <= tab_bar->ScrollingSpeed);
    fVar32 = ABS(fVar36 - fVar34) / 0.3;
    fVar37 = (float)(~uVar31 & (uint)fVar37 | (uint)tab_bar->ScrollingSpeed & uVar31);
    uVar31 = -(uint)(fVar32 <= fVar37);
    fVar32 = (float)(~uVar31 & (uint)fVar32 | uVar31 & (uint)fVar37);
    tab_bar->ScrollingSpeed = fVar32;
    fVar37 = fVar36;
    if ((pIVar13->FrameCount <= tab_bar->PrevFrameVisible + 1) &&
       (tab_bar->ScrollingTargetDistToVisibility <= fVar35 * 10.0)) {
      fVar32 = fVar32 * (pIVar13->IO).DeltaTime;
      if (fVar36 <= fVar34) {
        fVar37 = fVar34;
        if (fVar36 < fVar34) {
          fVar34 = fVar34 - fVar32;
          uVar31 = -(uint)(fVar36 <= fVar34);
          fVar37 = (float)((uint)fVar34 & uVar31 | ~uVar31 & (uint)fVar36);
        }
      }
      else {
        fVar37 = fVar34 + fVar32;
        if (fVar36 <= fVar37) {
          fVar37 = fVar36;
        }
      }
    }
    tab_bar->ScrollingAnim = fVar37;
  }
  else {
    tab_bar->ScrollingSpeed = 0.0;
  }
  fVar34 = (tab_bar->BarRect).Max.x;
  tab_bar->ScrollingRectMinX = fVar33 + (tab_bar->BarRect).Min.x + sections[0].Width;
  tab_bar->ScrollingRectMaxX = (fVar34 - sections[2].Width) - local_124;
  if ((tab_bar->Flags & 0x100000) == 0) {
    ImVector<char>::resize(&(tab_bar->TabsNames).Buf,0);
  }
  pIVar3 = pIVar13->CurrentWindow;
  (pIVar3->DC).CursorPos = (tab_bar->BarRect).Min;
  IVar4 = (tab_bar->BarRect).Min;
  IVar2 = (tab_bar->BarRect).Max;
  arrow_col.y = IVar2.y - IVar4.y;
  arrow_col.x = IVar2.x - IVar4.x;
  ItemSize((ImVec2 *)&arrow_col,(tab_bar->FramePadding).y);
  fVar34 = (tab_bar->BarRect).Min.x + tab_bar->WidthAllTabsIdeal;
  fVar33 = (pIVar3->DC).IdealMaxPos.x;
  uVar31 = -(uint)(fVar34 <= fVar33);
  (pIVar3->DC).IdealMaxPos.x = (float)(uVar31 & (uint)fVar33 | ~uVar31 & (uint)fVar34);
  return;
}

Assistant:

static void ImGui::TabBarLayout(ImGuiTabBar* tab_bar)
{
    ImGuiContext& g = *GImGui;
    tab_bar->WantLayout = false;

    // Garbage collect by compacting list
    // Detect if we need to sort out tab list (e.g. in rare case where a tab changed section)
    int tab_dst_n = 0;
    bool need_sort_by_section = false;
    ImGuiTabBarSection sections[3]; // Layout sections: Leading, Central, Trailing
    for (int tab_src_n = 0; tab_src_n < tab_bar->Tabs.Size; tab_src_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_src_n];
        if (tab->LastFrameVisible < tab_bar->PrevFrameVisible || tab->WantClose)
        {
            // Remove tab
            if (tab_bar->VisibleTabId == tab->ID) { tab_bar->VisibleTabId = 0; }
            if (tab_bar->SelectedTabId == tab->ID) { tab_bar->SelectedTabId = 0; }
            if (tab_bar->NextSelectedTabId == tab->ID) { tab_bar->NextSelectedTabId = 0; }
            continue;
        }
        if (tab_dst_n != tab_src_n)
            tab_bar->Tabs[tab_dst_n] = tab_bar->Tabs[tab_src_n];

        tab = &tab_bar->Tabs[tab_dst_n];
        tab->IndexDuringLayout = (ImS16)tab_dst_n;

        // We will need sorting if tabs have changed section (e.g. moved from one of Leading/Central/Trailing to another)
        int curr_tab_section_n = (tab->Flags & ImGuiTabItemFlags_Leading) ? 0 : (tab->Flags & ImGuiTabItemFlags_Trailing) ? 2 : 1;
        if (tab_dst_n > 0)
        {
            ImGuiTabItem* prev_tab = &tab_bar->Tabs[tab_dst_n - 1];
            int prev_tab_section_n = (prev_tab->Flags & ImGuiTabItemFlags_Leading) ? 0 : (prev_tab->Flags & ImGuiTabItemFlags_Trailing) ? 2 : 1;
            if (curr_tab_section_n == 0 && prev_tab_section_n != 0)
                need_sort_by_section = true;
            if (prev_tab_section_n == 2 && curr_tab_section_n != 2)
                need_sort_by_section = true;
        }

        sections[curr_tab_section_n].TabCount++;
        tab_dst_n++;
    }
    if (tab_bar->Tabs.Size != tab_dst_n)
        tab_bar->Tabs.resize(tab_dst_n);

    if (need_sort_by_section)
        ImQsort(tab_bar->Tabs.Data, tab_bar->Tabs.Size, sizeof(ImGuiTabItem), TabItemComparerBySection);

    // Calculate spacing between sections
    sections[0].Spacing = sections[0].TabCount > 0 && (sections[1].TabCount + sections[2].TabCount) > 0 ? g.Style.ItemInnerSpacing.x : 0.0f;
    sections[1].Spacing = sections[1].TabCount > 0 && sections[2].TabCount > 0 ? g.Style.ItemInnerSpacing.x : 0.0f;

    // Setup next selected tab
    ImGuiID scroll_track_selected_tab_id = 0;
    if (tab_bar->NextSelectedTabId)
    {
        tab_bar->SelectedTabId = tab_bar->NextSelectedTabId;
        tab_bar->NextSelectedTabId = 0;
        scroll_track_selected_tab_id = tab_bar->SelectedTabId;
    }

    // Process order change request (we could probably process it when requested but it's just saner to do it in a single spot).
    if (tab_bar->ReorderRequestTabId != 0)
    {
        if (TabBarProcessReorder(tab_bar))
            if (tab_bar->ReorderRequestTabId == tab_bar->SelectedTabId)
                scroll_track_selected_tab_id = tab_bar->ReorderRequestTabId;
        tab_bar->ReorderRequestTabId = 0;
    }

    // Tab List Popup (will alter tab_bar->BarRect and therefore the available width!)
    const bool tab_list_popup_button = (tab_bar->Flags & ImGuiTabBarFlags_TabListPopupButton) != 0;
    if (tab_list_popup_button)
        if (ImGuiTabItem* tab_to_select = TabBarTabListPopupButton(tab_bar)) // NB: Will alter BarRect.Min.x!
            scroll_track_selected_tab_id = tab_bar->SelectedTabId = tab_to_select->ID;

    // Leading/Trailing tabs will be shrink only if central one aren't visible anymore, so layout the shrink data as: leading, trailing, central
    // (whereas our tabs are stored as: leading, central, trailing)
    int shrink_buffer_indexes[3] = { 0, sections[0].TabCount + sections[2].TabCount, sections[0].TabCount };
    g.ShrinkWidthBuffer.resize(tab_bar->Tabs.Size);

    // Compute ideal tabs widths + store them into shrink buffer
    ImGuiTabItem* most_recently_selected_tab = NULL;
    int curr_section_n = -1;
    bool found_selected_tab_id = false;
    for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
        IM_ASSERT(tab->LastFrameVisible >= tab_bar->PrevFrameVisible);

        if ((most_recently_selected_tab == NULL || most_recently_selected_tab->LastFrameSelected < tab->LastFrameSelected) && !(tab->Flags & ImGuiTabItemFlags_Button))
            most_recently_selected_tab = tab;
        if (tab->ID == tab_bar->SelectedTabId)
            found_selected_tab_id = true;
        if (scroll_track_selected_tab_id == 0 && g.NavJustMovedToId == tab->ID)
            scroll_track_selected_tab_id = tab->ID;

        // Refresh tab width immediately, otherwise changes of style e.g. style.FramePadding.x would noticeably lag in the tab bar.
        // Additionally, when using TabBarAddTab() to manipulate tab bar order we occasionally insert new tabs that don't have a width yet,
        // and we cannot wait for the next BeginTabItem() call. We cannot compute this width within TabBarAddTab() because font size depends on the active window.
        const char* tab_name = tab_bar->GetTabName(tab);
        const bool has_close_button = (tab->Flags & ImGuiTabItemFlags_NoCloseButton) ? false : true;
        tab->ContentWidth = TabItemCalcSize(tab_name, has_close_button).x;

        int section_n = (tab->Flags & ImGuiTabItemFlags_Leading) ? 0 : (tab->Flags & ImGuiTabItemFlags_Trailing) ? 2 : 1;
        ImGuiTabBarSection* section = &sections[section_n];
        section->Width += tab->ContentWidth + (section_n == curr_section_n ? g.Style.ItemInnerSpacing.x : 0.0f);
        curr_section_n = section_n;

        // Store data so we can build an array sorted by width if we need to shrink tabs down
        int shrink_buffer_index = shrink_buffer_indexes[section_n]++;
        g.ShrinkWidthBuffer[shrink_buffer_index].Index = tab_n;
        g.ShrinkWidthBuffer[shrink_buffer_index].Width = tab->ContentWidth;

        IM_ASSERT(tab->ContentWidth > 0.0f);
        tab->Width = tab->ContentWidth;
    }

    // Compute total ideal width (used for e.g. auto-resizing a window)
    tab_bar->WidthAllTabsIdeal = 0.0f;
    for (int section_n = 0; section_n < 3; section_n++)
        tab_bar->WidthAllTabsIdeal += sections[section_n].Width + sections[section_n].Spacing;

    // Horizontal scrolling buttons
    // (note that TabBarScrollButtons() will alter BarRect.Max.x)
    if ((tab_bar->WidthAllTabsIdeal > tab_bar->BarRect.GetWidth() && tab_bar->Tabs.Size > 1) && !(tab_bar->Flags & ImGuiTabBarFlags_NoTabListScrollingButtons) && (tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyScroll))
        if (ImGuiTabItem* scroll_track_selected_tab = TabBarScrollingButtons(tab_bar))
        {
            scroll_track_selected_tab_id = scroll_track_selected_tab->ID;
            if (!(scroll_track_selected_tab->Flags & ImGuiTabItemFlags_Button))
                tab_bar->SelectedTabId = scroll_track_selected_tab_id;
        }

    // Shrink widths if full tabs don't fit in their allocated space
    float section_0_w = sections[0].Width + sections[0].Spacing;
    float section_1_w = sections[1].Width + sections[1].Spacing;
    float section_2_w = sections[2].Width + sections[2].Spacing;
    bool central_section_is_visible = (section_0_w + section_2_w) < tab_bar->BarRect.GetWidth();
    float width_excess;
    if (central_section_is_visible)
        width_excess = ImMax(section_1_w - (tab_bar->BarRect.GetWidth() - section_0_w - section_2_w), 0.0f); // Excess used to shrink central section
    else
        width_excess = (section_0_w + section_2_w) - tab_bar->BarRect.GetWidth(); // Excess used to shrink leading/trailing section

    // With ImGuiTabBarFlags_FittingPolicyScroll policy, we will only shrink leading/trailing if the central section is not visible anymore
    if (width_excess > 0.0f && ((tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyResizeDown) || !central_section_is_visible))
    {
        int shrink_data_count = (central_section_is_visible ? sections[1].TabCount : sections[0].TabCount + sections[2].TabCount);
        int shrink_data_offset = (central_section_is_visible ? sections[0].TabCount + sections[2].TabCount : 0);
        ShrinkWidths(g.ShrinkWidthBuffer.Data + shrink_data_offset, shrink_data_count, width_excess);

        // Apply shrunk values into tabs and sections
        for (int tab_n = shrink_data_offset; tab_n < shrink_data_offset + shrink_data_count; tab_n++)
        {
            ImGuiTabItem* tab = &tab_bar->Tabs[g.ShrinkWidthBuffer[tab_n].Index];
            float shrinked_width = IM_FLOOR(g.ShrinkWidthBuffer[tab_n].Width);
            if (shrinked_width < 0.0f)
                continue;

            int section_n = (tab->Flags & ImGuiTabItemFlags_Leading) ? 0 : (tab->Flags & ImGuiTabItemFlags_Trailing) ? 2 : 1;
            sections[section_n].Width -= (tab->Width - shrinked_width);
            tab->Width = shrinked_width;
        }
    }

    // Layout all active tabs
    int section_tab_index = 0;
    float tab_offset = 0.0f;
    tab_bar->WidthAllTabs = 0.0f;
    for (int section_n = 0; section_n < 3; section_n++)
    {
        ImGuiTabBarSection* section = &sections[section_n];
        if (section_n == 2)
            tab_offset = ImMin(ImMax(0.0f, tab_bar->BarRect.GetWidth() - section->Width), tab_offset);

        for (int tab_n = 0; tab_n < section->TabCount; tab_n++)
        {
            ImGuiTabItem* tab = &tab_bar->Tabs[section_tab_index + tab_n];
            tab->Offset = tab_offset;
            tab_offset += tab->Width + (tab_n < section->TabCount - 1 ? g.Style.ItemInnerSpacing.x : 0.0f);
        }
        tab_bar->WidthAllTabs += ImMax(section->Width + section->Spacing, 0.0f);
        tab_offset += section->Spacing;
        section_tab_index += section->TabCount;
    }

    // If we have lost the selected tab, select the next most recently active one
    if (found_selected_tab_id == false)
        tab_bar->SelectedTabId = 0;
    if (tab_bar->SelectedTabId == 0 && tab_bar->NextSelectedTabId == 0 && most_recently_selected_tab != NULL)
        scroll_track_selected_tab_id = tab_bar->SelectedTabId = most_recently_selected_tab->ID;

    // Lock in visible tab
    tab_bar->VisibleTabId = tab_bar->SelectedTabId;
    tab_bar->VisibleTabWasSubmitted = false;

    // Update scrolling
    if (scroll_track_selected_tab_id)
        if (ImGuiTabItem* scroll_track_selected_tab = TabBarFindTabByID(tab_bar, scroll_track_selected_tab_id))
            TabBarScrollToTab(tab_bar, scroll_track_selected_tab, sections);
    tab_bar->ScrollingAnim = TabBarScrollClamp(tab_bar, tab_bar->ScrollingAnim);
    tab_bar->ScrollingTarget = TabBarScrollClamp(tab_bar, tab_bar->ScrollingTarget);
    if (tab_bar->ScrollingAnim != tab_bar->ScrollingTarget)
    {
        // Scrolling speed adjust itself so we can always reach our target in 1/3 seconds.
        // Teleport if we are aiming far off the visible line
        tab_bar->ScrollingSpeed = ImMax(tab_bar->ScrollingSpeed, 70.0f * g.FontSize);
        tab_bar->ScrollingSpeed = ImMax(tab_bar->ScrollingSpeed, ImFabs(tab_bar->ScrollingTarget - tab_bar->ScrollingAnim) / 0.3f);
        const bool teleport = (tab_bar->PrevFrameVisible + 1 < g.FrameCount) || (tab_bar->ScrollingTargetDistToVisibility > 10.0f * g.FontSize);
        tab_bar->ScrollingAnim = teleport ? tab_bar->ScrollingTarget : ImLinearSweep(tab_bar->ScrollingAnim, tab_bar->ScrollingTarget, g.IO.DeltaTime * tab_bar->ScrollingSpeed);
    }
    else
    {
        tab_bar->ScrollingSpeed = 0.0f;
    }
    tab_bar->ScrollingRectMinX = tab_bar->BarRect.Min.x + sections[0].Width + sections[0].Spacing;
    tab_bar->ScrollingRectMaxX = tab_bar->BarRect.Max.x - sections[2].Width - sections[1].Spacing;

    // Clear name buffers
    if ((tab_bar->Flags & ImGuiTabBarFlags_DockNode) == 0)
        tab_bar->TabsNames.Buf.resize(0);

    // Actual layout in host window (we don't do it in BeginTabBar() so as not to waste an extra frame)
    ImGuiWindow* window = g.CurrentWindow;
    window->DC.CursorPos = tab_bar->BarRect.Min;
    ItemSize(tab_bar->BarRect.GetSize(), tab_bar->FramePadding.y);
    window->DC.IdealMaxPos.x = ImMax(window->DC.IdealMaxPos.x, tab_bar->BarRect.Min.x + tab_bar->WidthAllTabsIdeal);
}